

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_cache.cc
# Opt level: O1

shared_ptr<StorageClient> __thiscall
StorageCache::CreateClient(StorageCache *this,DatanodeInfo *dn_info)

{
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<StorageClient> sVar1;
  undefined1 local_31;
  int local_30;
  int local_2c;
  NarpcStorageClient *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  local_2c = *(int *)(in_RDX + 0x14);
  local_30 = *(int *)(in_RDX + 0x18);
  local_28 = (NarpcStorageClient *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<NarpcStorageClient,std::allocator<NarpcStorageClient>,int,int>
            (&_Stack_20,&local_28,(allocator<NarpcStorageClient> *)&local_31,&local_2c,&local_30);
  *(undefined8 *)&(this->cache_)._M_t._M_impl = 0;
  this->_vptr_StorageCache = (_func_int **)local_28;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->cache_)._M_t._M_impl = _Stack_20._M_pi;
  sVar1.super___shared_ptr<StorageClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<StorageClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<StorageClient>)
         sVar1.super___shared_ptr<StorageClient,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<StorageClient> StorageCache::CreateClient(DatanodeInfo dn_info) {
  if (dn_info.storage_class() == 0) {
    return make_shared<NarpcStorageClient>(dn_info.addr(), dn_info.port());
  } else {
    return make_shared<NarpcStorageClient>(dn_info.addr(), dn_info.port());
  }
}